

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter.h
# Opt level: O0

void aom_write_symbol(aom_writer *w,int symb,aom_cdf_prob *cdf,int nsymbs)

{
  int in_ECX;
  aom_cdf_prob *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  aom_write_cdf((aom_writer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (int)((ulong)in_RDX >> 0x20),
                (aom_cdf_prob *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc
               );
  if (*(char *)(in_RDI + 0x30) != '\0') {
    update_cdf(in_RDX,(int8_t)in_ESI,in_ECX);
  }
  return;
}

Assistant:

static inline void aom_write_symbol(aom_writer *w, int symb, aom_cdf_prob *cdf,
                                    int nsymbs) {
  aom_write_cdf(w, symb, cdf, nsymbs);
  if (w->allow_update_cdf) update_cdf(cdf, symb, nsymbs);
}